

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::convert_string_to_number_scratch
               (char_t (*buffer) [32],char_t *begin,char_t *end,double *out_result)

{
  ulong __n;
  char_t *string;
  double *in_RCX;
  long in_RDX;
  void *in_RSI;
  char_t *in_RDI;
  double dVar1;
  char_t *scratch;
  size_t length;
  bool local_1;
  
  __n = in_RDX - (long)in_RSI;
  string = in_RDI;
  if ((__n < 0x20) ||
     (string = (char_t *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(__n + 1), string != (char_t *)0x0)) {
    memcpy(string,in_RSI,__n);
    string[__n] = '\0';
    dVar1 = convert_string_to_number(string);
    *in_RCX = dVar1;
    if (string != in_RDI) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (string);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool convert_string_to_number_scratch(char_t (&buffer)[32], const char_t* begin, const char_t* end, double* out_result)
	{
		size_t length = static_cast<size_t>(end - begin);
		char_t* scratch = buffer;

		if (length >= sizeof(buffer) / sizeof(buffer[0]))
		{
			// need to make dummy on-heap copy
			scratch = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
			if (!scratch) return false;
		}

		// copy string to zero-terminated buffer and perform conversion
		memcpy(scratch, begin, length * sizeof(char_t));
		scratch[length] = 0;

		*out_result = convert_string_to_number(scratch);

		// free dummy buffer
		if (scratch != buffer) xml_memory::deallocate(scratch);

		return true;
	}